

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O1

int xSAT_ReadInt(char **pIn)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  
  ppuVar5 = __ctype_b_loc();
  pcVar12 = *pIn;
  cVar1 = *pcVar12;
  bVar2 = *(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1);
  while ((bVar2 & 0x20) != 0) {
    pcVar12 = pcVar12 + 1;
    *pIn = pcVar12;
    cVar1 = *pcVar12;
    bVar2 = *(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1);
  }
  if ((cVar1 == '-') || (cVar1 == '+')) {
    *pIn = pcVar12 + 1;
  }
  if ((*(byte *)((long)*ppuVar5 + (long)**pIn * 2 + 1) & 8) != 0) {
    pcVar12 = *pIn;
    lVar14 = (long)*pcVar12;
    iVar13 = 0;
    if ((*(byte *)((long)*ppuVar5 + lVar14 * 2 + 1) & 8) != 0) {
      iVar13 = 0;
      do {
        pcVar12 = pcVar12 + 1;
        iVar13 = (int)(char)lVar14 + iVar13 * 10 + -0x30;
        *pIn = pcVar12;
        lVar14 = (long)*pcVar12;
      } while ((*(byte *)((long)*ppuVar5 + lVar14 * 2 + 1) & 8) != 0);
    }
    iVar4 = -iVar13;
    if (cVar1 != '-') {
      iVar4 = iVar13;
    }
    return iVar4;
  }
  xSAT_ReadInt_cold_1();
  puVar6 = (undefined4 *)calloc(1,0x1e8);
  *(undefined8 *)(puVar6 + 100) = 0;
  *(undefined8 *)(puVar6 + 0x66) = 0;
  *(undefined8 *)(puVar6 + 0x74) = 0;
  *(undefined8 *)(puVar6 + 0x76) = 0;
  *(undefined8 *)(puVar6 + 0x70) = 0;
  *(undefined8 *)(puVar6 + 0x72) = 0;
  *(undefined8 *)(puVar6 + 0x60) = 0;
  *(undefined8 *)(puVar6 + 0x62) = 0;
  *(undefined8 *)(puVar6 + 0x78) = 0;
  *(undefined8 *)(puVar6 + 100) = 0x3fe999999999999a;
  *(undefined8 *)(puVar6 + 0x66) = 0x3ff6666666666666;
  *(undefined8 *)(puVar6 + 0x68) = 0x3200002710;
  *(undefined8 *)(puVar6 + 0x6a) = 0x7d000001388;
  *(undefined8 *)(puVar6 + 0x6c) = 0x3e80000012c;
  *(undefined8 *)(puVar6 + 0x6e) = 0x3f0000000000001e;
  *(undefined8 *)(puVar6 + 0x74) = 0x14c924d692ca61b;
  *(undefined8 *)(puVar6 + 0x70) = 0x3fee666666666666;
  *(undefined8 *)(puVar6 + 0x72) = 0xc800000000;
  *(undefined8 *)(puVar6 + 0x76) = 0x60000001e;
  puVar6[0x78] = 0x3e99999a;
  *puVar6 = 1;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 2) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 4) = puVar7;
  pvVar8 = calloc(1,0x18);
  uVar3 = *(uint *)((long)pvVar8 + 4);
  uVar11 = uVar3;
  if (uVar3 < 0x100000) {
    while (uVar11 < 0x100000) {
      uVar11 = uVar11 + ((uVar11 >> 1) + (uVar11 >> 3) + 2 & 0xffffe);
      *(uint *)((long)pvVar8 + 4) = uVar11;
      if (uVar11 < uVar3) {
        __assert_fail("p->cap >= prev_cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/satoko/cdb.h"
                      ,0x2f,"void cdb_grow(struct cdb *, unsigned int)");
      }
    }
    pvVar9 = realloc(*(void **)((long)pvVar8 + 0x10),(ulong)uVar11 << 2);
    *(void **)((long)pvVar8 + 0x10) = pvVar9;
  }
  *(void **)(puVar6 + 6) = pvVar8;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 10) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 8) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 4;
  pvVar8 = calloc(0x60,0x18);
  puVar7[1] = pvVar8;
  *(undefined8 **)(puVar6 + 0xc) = puVar7;
  *(undefined8 *)(puVar6 + 0xe) = 0x800000000000;
  puVar6[0x10] = 0x800;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x12) = puVar7;
  puVar10 = (undefined8 *)malloc(0x18);
  puVar10[2] = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *puVar10 = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar10[1] = puVar7;
  *(undefined8 **)(puVar6 + 0x14) = puVar10;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x16) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x18) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x1a) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x1c) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x1e) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x20) = puVar7;
  uVar3 = puVar6[0x6a];
  pvVar8 = calloc(1,0x20);
  *(uint *)((long)pvVar8 + 4) = uVar3;
  pvVar9 = calloc((ulong)uVar3,4);
  *(void **)((long)pvVar8 + 0x18) = pvVar9;
  *(void **)(puVar6 + 0x30) = pvVar8;
  uVar3 = puVar6[0x69];
  pvVar8 = calloc(1,0x20);
  *(uint *)((long)pvVar8 + 4) = uVar3;
  pvVar9 = calloc((ulong)uVar3,4);
  *(void **)((long)pvVar8 + 0x18) = pvVar9;
  *(void **)(puVar6 + 0x32) = pvVar8;
  *(ulong *)(puVar6 + 0x38) = (ulong)(uint)puVar6[0x6b];
  *(undefined8 *)(puVar6 + 0x34) = 1;
  *(ulong *)(puVar6 + 0x36) = (ulong)(uint)puVar6[0x6b];
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x26) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x28) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x2a) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x2c) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x2e) = puVar7;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  *(undefined8 **)(puVar6 + 0x3c) = puVar7;
  return (int)puVar6;
}

Assistant:

static int xSAT_ReadInt( char ** pIn )
{
    int val = 0;
    int neg = 0;

    for(; isspace(**pIn); (*pIn)++);
    if ( **pIn == '-' )
        neg = 1,
        (*pIn)++;
    else if ( **pIn == '+' )
        (*pIn)++;
    if ( !isdigit(**pIn) )
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn),
        exit(1);
    while ( isdigit(**pIn) )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val;
}